

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

bool bssl::do_seal_record
               (SSL *ssl,uint8_t *out_prefix,uint8_t *out,uint8_t *out_suffix,uint8_t type,
               uint8_t *in,size_t in_len)

{
  Span<const_unsigned_char> header_00;
  SSLAEADContext *a;
  uint8_t *b;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t b_bytes;
  ulong uVar4;
  Span<const_unsigned_char> in_00;
  Span<unsigned_char> local_a8;
  uchar *local_98;
  Span<const_unsigned_char> header;
  undefined2 uStack_80;
  uint16_t record_version;
  size_t ciphertext_len;
  size_t suffix_len;
  size_t extra_in_len;
  uint8_t *extra_in;
  SSLAEADContext *aead;
  uint8_t *in_local;
  uint8_t *puStack_48;
  uint8_t type_local;
  uint8_t *out_suffix_local;
  uint8_t *out_local;
  uint8_t *out_prefix_local;
  SSL *ssl_local;
  
  aead = (SSLAEADContext *)in;
  in_local._7_1_ = type;
  puStack_48 = out_suffix;
  out_suffix_local = out;
  out_local = out_prefix;
  out_prefix_local = (uint8_t *)ssl;
  extra_in = (uint8_t *)
             std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::get
                       (&ssl->s3->aead_write_ctx);
  extra_in_len = 0;
  suffix_len = 0;
  bVar1 = SSLAEADContext::is_null_cipher((SSLAEADContext *)extra_in);
  if ((!bVar1) && (uVar2 = ssl_protocol_version((SSL *)out_prefix_local), 0x303 < uVar2)) {
    extra_in_len = (long)&in_local + 7;
    suffix_len = 1;
  }
  bVar1 = SSLAEADContext::SuffixLen((SSLAEADContext *)extra_in,&ciphertext_len,in_len,suffix_len);
  if ((bVar1) &&
     (bVar1 = SSLAEADContext::CiphertextLen
                        ((SSLAEADContext *)extra_in,(size_t *)&stack0xffffffffffffff80,in_len,
                         suffix_len), bVar1)) {
    bVar1 = true;
    if (aead != (SSLAEADContext *)out_suffix_local) {
      iVar3 = buffers_alias(aead,in_len,out_suffix_local,in_len);
      bVar1 = iVar3 == 0;
    }
    b = out_local;
    a = aead;
    if (!bVar1) {
      __assert_fail("in == out || !buffers_alias(in, in_len, out, in_len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11a,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    b_bytes = ssl_record_prefix_len((SSL *)out_prefix_local);
    iVar3 = buffers_alias(a,in_len,b,b_bytes);
    if (iVar3 != 0) {
      __assert_fail("!buffers_alias(in, in_len, out_prefix, ssl_record_prefix_len(ssl))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11b,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    iVar3 = buffers_alias(aead,in_len,puStack_48,ciphertext_len);
    if (iVar3 != 0) {
      __assert_fail("!buffers_alias(in, in_len, out_suffix, suffix_len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11c,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    if (suffix_len == 0) {
      *out_local = in_local._7_1_;
    }
    else {
      *out_local = '\x17';
    }
    header.size_._6_2_ = tls_record_version((SSL *)out_prefix_local);
    out_local[1] = (uint8_t)(header.size_._6_2_ >> 8);
    out_local[2] = (uint8_t)header.size_._6_2_;
    out_local[3] = (uint8_t)((ushort)uStack_80 >> 8);
    out_local[4] = (uint8_t)uStack_80;
    Span<unsigned_char>::Span(&local_a8,out_local,5);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_98,&local_a8);
    if (*(long *)(*(long *)(out_prefix_local + 0x30) + 8) == -1) {
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x12d);
      ssl_local._7_1_ = false;
    }
    else {
      uVar4 = (ulong)header.size_._6_2_;
      header_00.size_ = (size_t)header.data_;
      header_00.data_ = local_98;
      bVar1 = SSLAEADContext::SealScatter
                        ((SSLAEADContext *)extra_in,out_local + 5,out_suffix_local,puStack_48,
                         *out_local,header.size_._6_2_,
                         *(uint64_t *)(*(long *)(out_prefix_local + 0x30) + 8),header_00,
                         (uint8_t *)aead,in_len,(uint8_t *)extra_in_len,suffix_len);
      if (bVar1) {
        *(long *)(*(long *)(out_prefix_local + 0x30) + 8) =
             *(long *)(*(long *)(out_prefix_local + 0x30) + 8) + 1;
        in_00.size_ = uVar4;
        in_00.data_ = header.data_;
        ssl_do_msg_callback((bssl *)out_prefix_local,(SSL *)0x1,0x100,(int)local_98,in_00);
        ssl_local._7_1_ = true;
      }
      else {
        ssl_local._7_1_ = false;
      }
    }
  }
  else {
    ERR_put_error(0x10,0,200,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0x116);
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

static bool do_seal_record(SSL *ssl, uint8_t *out_prefix, uint8_t *out,
                           uint8_t *out_suffix, uint8_t type, const uint8_t *in,
                           const size_t in_len) {
  SSLAEADContext *aead = ssl->s3->aead_write_ctx.get();
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (!aead->is_null_cipher() && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    // TLS 1.3 hides the actual record type inside the encrypted data.
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t suffix_len, ciphertext_len;
  if (!aead->SuffixLen(&suffix_len, in_len, extra_in_len) ||
      !aead->CiphertextLen(&ciphertext_len, in_len, extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }

  assert(in == out || !buffers_alias(in, in_len, out, in_len));
  assert(!buffers_alias(in, in_len, out_prefix, ssl_record_prefix_len(ssl)));
  assert(!buffers_alias(in, in_len, out_suffix, suffix_len));

  if (extra_in_len) {
    out_prefix[0] = SSL3_RT_APPLICATION_DATA;
  } else {
    out_prefix[0] = type;
  }

  uint16_t record_version = tls_record_version(ssl);
  out_prefix[1] = record_version >> 8;
  out_prefix[2] = record_version & 0xff;
  out_prefix[3] = ciphertext_len >> 8;
  out_prefix[4] = ciphertext_len & 0xff;
  Span<const uint8_t> header = Span(out_prefix, SSL3_RT_HEADER_LENGTH);

  // Ensure the sequence number update does not overflow.
  if (ssl->s3->write_sequence + 1 == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  if (!aead->SealScatter(out_prefix + SSL3_RT_HEADER_LENGTH, out, out_suffix,
                         out_prefix[0], record_version, ssl->s3->write_sequence,
                         header, in, in_len, extra_in, extra_in_len)) {
    return false;
  }

  ssl->s3->write_sequence++;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}